

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O1

void pospopcnt_u8_sse_popcnt4bit(uint8_t *data,size_t len,uint32_t *flag_counts)

{
  undefined1 (*pauVar1) [16];
  ulong uVar2;
  int j;
  int iVar3;
  long lVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined8 uVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [64];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  undefined1 auVar44 [64];
  undefined1 auVar45 [32];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 in_ZMM16 [64];
  
  auVar6 = in_ZMM16._0_16_;
  if ((len & 0xffffffffffffffc0) == 0) {
    auVar27 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    bVar5 = true;
    auVar25 = (undefined1  [16])0x0;
    auVar23 = (undefined1  [16])0x0;
    auVar21 = (undefined1  [16])0x0;
    auVar19 = (undefined1  [16])0x0;
    auVar24 = (undefined1  [16])0x0;
    auVar22 = (undefined1  [16])0x0;
    auVar20 = (undefined1  [16])0x0;
    auVar18 = (undefined1  [16])0x0;
    auVar30 = (undefined1  [16])0x0;
    auVar17 = (undefined1  [16])0x0;
    auVar16 = (undefined1  [16])0x0;
    auVar15 = (undefined1  [16])0x0;
    auVar14 = (undefined1  [16])0x0;
    auVar13 = (undefined1  [16])0x0;
    auVar12 = (undefined1  [16])0x0;
  }
  else {
    pauVar1 = (undefined1 (*) [16])(data + (len & 0xffffffffffffffc0));
    auVar49 = ZEXT1664((undefined1  [16])0x0);
    iVar3 = 0;
    auVar37 = ZEXT1664((undefined1  [16])0x0);
    auVar6 = vpbroadcastq_avx512vl(ZEXT816(0x5555555555555555));
    auVar7 = vpbroadcastq_avx512vl(ZEXT816(0xaaaaaaaaaaaaaaaa));
    auVar8 = vpbroadcastq_avx512vl(ZEXT816(0x3333333333333333));
    auVar9 = vpbroadcastq_avx512vl(ZEXT816(0xcccccccccccccccc));
    auVar10 = vpbroadcastb_avx512vl(ZEXT116(0xf));
    auVar11 = vmovdqa64_avx512vl(_DAT_0011f1c0);
    auVar42 = ZEXT1664((undefined1  [16])0x0);
    auVar41 = ZEXT1664((undefined1  [16])0x0);
    auVar40 = ZEXT1664((undefined1  [16])0x0);
    auVar33 = ZEXT1664((undefined1  [16])0x0);
    auVar34 = ZEXT1664((undefined1  [16])0x0);
    auVar32 = ZEXT1664((undefined1  [16])0x0);
    auVar29 = ZEXT1664((undefined1  [16])0x0);
    auVar52 = ZEXT1664((undefined1  [16])0x0);
    auVar51 = ZEXT1664((undefined1  [16])0x0);
    auVar50 = ZEXT1664((undefined1  [16])0x0);
    auVar48 = ZEXT1664((undefined1  [16])0x0);
    auVar47 = ZEXT1664((undefined1  [16])0x0);
    auVar46 = ZEXT1664((undefined1  [16])0x0);
    auVar44 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar12 = vmovdqu64_avx512vl(*(undefined1 (*) [16])data);
      auVar13 = vmovdqu64_avx512vl(*(undefined1 (*) [16])((long)data + 0x10));
      auVar14 = vmovdqu64_avx512vl(*(undefined1 (*) [16])((long)data + 0x20));
      auVar15 = vmovdqu64_avx512vl(*(undefined1 (*) [16])((long)data + 0x30));
      auVar16 = vpaddb_avx512vl(auVar13,auVar13);
      auVar16 = vpternlogq_avx512vl(auVar16,auVar7,auVar12,0xe2);
      auVar13 = vpsrld_avx512vl(auVar13,1);
      auVar12 = vpternlogq_avx512vl(auVar13,auVar6,auVar12,0xe2);
      auVar13 = vpaddb_avx512vl(auVar15,auVar15);
      auVar13 = vpternlogq_avx512vl(auVar13,auVar7,auVar14,0xe2);
      auVar15 = vpsrld_avx512vl(auVar15,1);
      auVar14 = vpternlogq_avx512vl(auVar15,auVar6,auVar14,0xe2);
      auVar15 = vpslld_avx512vl(auVar13,2);
      auVar15 = vpternlogq_avx512vl(auVar15,auVar9,auVar16,0xe2);
      auVar17 = vpslld_avx512vl(auVar14,2);
      auVar17 = vpternlogq_avx512vl(auVar17,auVar9,auVar12,0xe2);
      auVar13 = vpsrld_avx512vl(auVar13,2);
      auVar13 = vpternlogq_avx512vl(auVar13,auVar8,auVar16,0xe2);
      auVar14 = vpsrld_avx512vl(auVar14,2);
      auVar12 = vpternlogq_avx512vl(auVar14,auVar8,auVar12,0xe2);
      auVar14 = vpandq_avx512vl(auVar15,auVar10);
      auVar14 = vpshufb_avx512vl(auVar11,auVar14);
      auVar18 = vpaddb_avx512vl(auVar14,auVar49._0_16_);
      auVar14 = vpsrld_avx512vl(auVar15,4);
      auVar14 = vpandq_avx512vl(auVar14,auVar10);
      auVar14 = vpshufb_avx512vl(auVar11,auVar14);
      auVar19 = vpaddb_avx512vl(auVar14,auVar48._0_16_);
      auVar14 = vpandq_avx512vl(auVar17,auVar10);
      auVar14 = vpshufb_avx512vl(auVar11,auVar14);
      auVar20 = vpaddb_avx512vl(auVar14,auVar52._0_16_);
      auVar14 = vpsrld_avx512vl(auVar17,4);
      auVar14 = vpandq_avx512vl(auVar14,auVar10);
      auVar14 = vpshufb_avx512vl(auVar11,auVar14);
      auVar21 = vpaddb_avx512vl(auVar14,auVar47._0_16_);
      auVar14 = vpandq_avx512vl(auVar13,auVar10);
      auVar14 = vpshufb_avx512vl(auVar11,auVar14);
      auVar22 = vpaddb_avx512vl(auVar14,auVar51._0_16_);
      auVar13 = vpsrld_avx512vl(auVar13,4);
      auVar13 = vpandq_avx512vl(auVar13,auVar10);
      auVar13 = vpshufb_avx512vl(auVar11,auVar13);
      auVar23 = vpaddb_avx512vl(auVar13,auVar46._0_16_);
      auVar13 = vpandq_avx512vl(auVar12,auVar10);
      auVar13 = vpshufb_avx512vl(auVar11,auVar13);
      auVar24 = vpaddb_avx512vl(auVar13,auVar50._0_16_);
      auVar12 = vpsrld_avx512vl(auVar12,4);
      auVar12 = vpandq_avx512vl(auVar12,auVar10);
      auVar12 = vpshufb_avx512vl(auVar11,auVar12);
      auVar25 = vpaddb_avx512vl(auVar12,auVar44._0_16_);
      iVar3 = iVar3 + 1;
      if (iVar3 == 0x3f) {
        auVar13 = vpxord_avx512vl(auVar12,auVar12);
        auVar12 = vpsadbw_avx512vl(auVar18,auVar13);
        auVar12 = vpaddq_avx(auVar12,auVar37._0_16_);
        auVar37 = ZEXT1664(auVar12);
        auVar12 = vpsadbw_avx512vl(auVar20,auVar13);
        auVar12 = vpaddq_avx(auVar12,auVar42._0_16_);
        auVar42 = ZEXT1664(auVar12);
        auVar12 = vpsadbw_avx512vl(auVar22,auVar13);
        auVar12 = vpaddq_avx(auVar12,auVar41._0_16_);
        auVar41 = ZEXT1664(auVar12);
        auVar12 = vpsadbw_avx512vl(auVar24,auVar13);
        auVar12 = vpaddq_avx(auVar12,auVar40._0_16_);
        auVar40 = ZEXT1664(auVar12);
        auVar12 = vpsadbw_avx512vl(auVar19,auVar13);
        auVar12 = vpaddq_avx(auVar12,auVar33._0_16_);
        auVar33 = ZEXT1664(auVar12);
        auVar12 = vpsadbw_avx512vl(auVar21,auVar13);
        auVar12 = vpaddq_avx(auVar12,auVar34._0_16_);
        auVar34 = ZEXT1664(auVar12);
        auVar12 = vpsadbw_avx512vl(auVar23,auVar13);
        auVar12 = vpaddq_avx(auVar12,auVar32._0_16_);
        auVar32 = ZEXT1664(auVar12);
        auVar12 = vpsadbw_avx512vl(auVar25,auVar13);
        auVar12 = vpaddq_avx(auVar12,auVar29._0_16_);
        auVar29 = ZEXT1664(auVar12);
        iVar3 = 0;
        auVar25 = (undefined1  [16])0x0;
        auVar23 = (undefined1  [16])0x0;
        auVar21 = (undefined1  [16])0x0;
        auVar19 = (undefined1  [16])0x0;
        auVar24 = (undefined1  [16])0x0;
        auVar22 = (undefined1  [16])0x0;
        auVar20 = (undefined1  [16])0x0;
        auVar18 = (undefined1  [16])0x0;
      }
      auVar15 = auVar40._0_16_;
      auVar27 = auVar29._0_32_;
      auVar30 = auVar32._0_16_;
      auVar17 = auVar34._0_16_;
      auVar16 = auVar33._0_16_;
      auVar14 = auVar41._0_16_;
      auVar13 = auVar42._0_16_;
      auVar12 = auVar37._0_16_;
      auVar52 = ZEXT1664(auVar20);
      auVar51 = ZEXT1664(auVar22);
      auVar50 = ZEXT1664(auVar24);
      auVar49 = ZEXT1664(auVar18);
      auVar48 = ZEXT1664(auVar19);
      auVar47 = ZEXT1664(auVar21);
      auVar46 = ZEXT1664(auVar23);
      auVar44 = ZEXT1664(auVar25);
      data = (uint8_t *)((long)data + 0x40);
    } while ((undefined1 (*) [16])data != pauVar1);
    bVar5 = iVar3 == 0;
  }
  if (!bVar5) {
    auVar7 = vpxord_avx512vl(auVar6,auVar6);
    auVar6 = vpsadbw_avx512vl(auVar18,auVar7);
    auVar12 = vpaddq_avx(auVar6,auVar12);
    auVar6 = vpsadbw_avx512vl(auVar20,auVar7);
    auVar13 = vpaddq_avx(auVar6,auVar13);
    auVar6 = vpsadbw_avx512vl(auVar22,auVar7);
    auVar14 = vpaddq_avx(auVar6,auVar14);
    auVar6 = vpsadbw_avx512vl(auVar24,auVar7);
    auVar15 = vpaddq_avx(auVar6,auVar15);
    auVar6 = vpsadbw_avx512vl(auVar19,auVar7);
    auVar16 = vpaddq_avx(auVar6,auVar16);
    auVar6 = vpsadbw_avx512vl(auVar21,auVar7);
    auVar17 = vpaddq_avx(auVar6,auVar17);
    auVar6 = vpsadbw_avx512vl(auVar23,auVar7);
    auVar30 = vpaddq_avx(auVar6,auVar30);
    auVar6 = vpsadbw_avx512vl(auVar25,auVar7);
    auVar6 = vpaddq_avx(auVar6,auVar27._0_16_);
    auVar27 = ZEXT1632(auVar6);
  }
  auVar6 = vpunpcklqdq_avx(auVar12,auVar13);
  auVar43._0_16_ = ZEXT116(0) * auVar14 + ZEXT116(1) * auVar6;
  auVar43._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar14;
  uVar26 = auVar15._0_8_;
  auVar45._8_8_ = uVar26;
  auVar45._0_8_ = uVar26;
  auVar45._16_8_ = uVar26;
  auVar45._24_8_ = uVar26;
  auVar36 = vpblendd_avx2(auVar43,auVar45,0xc0);
  auVar12 = vpunpckhqdq_avx(auVar12,auVar13);
  auVar6 = vpshufd_avx(auVar14,0xee);
  auVar35._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar12;
  auVar35._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar6;
  auVar13 = auVar27._0_16_;
  auVar38._0_16_ = ZEXT116(0) * auVar15 + ZEXT116(1) * auVar13;
  auVar38._16_16_ = ZEXT116(0) * auVar27._16_16_ + ZEXT116(1) * auVar15;
  auVar28 = vpblendd_avx2(auVar35,auVar38,0xc0);
  auVar36 = vpaddq_avx2(auVar36,auVar28);
  auVar6 = vpmovqd_avx512vl(auVar36);
  auVar6 = vpaddd_avx(auVar6,*(undefined1 (*) [16])flag_counts);
  *(undefined1 (*) [16])flag_counts = auVar6;
  auVar6 = vpunpcklqdq_avx(auVar16,auVar17);
  auVar36._0_16_ = ZEXT116(0) * auVar30 + ZEXT116(1) * auVar6;
  auVar36._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar30;
  uVar26 = auVar27._0_8_;
  auVar39._8_8_ = uVar26;
  auVar39._0_8_ = uVar26;
  auVar39._16_8_ = uVar26;
  auVar39._24_8_ = uVar26;
  auVar36 = vpblendd_avx2(auVar36,auVar39,0xc0);
  auVar12 = vpunpckhqdq_avx(auVar16,auVar17);
  auVar6 = vpshufd_avx(auVar30,0xee);
  auVar31._0_16_ = ZEXT116(0) * auVar6 + ZEXT116(1) * auVar12;
  auVar31._16_16_ = ZEXT116(1) * auVar6;
  auVar28._0_16_ = ZEXT116(0) * auVar13 + ZEXT116(1) * auVar13;
  auVar28._16_16_ = ZEXT116(0) * auVar27._16_16_ + ZEXT116(1) * auVar13;
  auVar27 = vpblendd_avx2(auVar31,auVar28,0xc0);
  auVar27 = vpaddq_avx2(auVar36,auVar27);
  auVar6 = vpmovqd_avx512vl(auVar27);
  auVar6 = vpaddd_avx(auVar6,*(undefined1 (*) [16])(flag_counts + 4));
  *(undefined1 (*) [16])(flag_counts + 4) = auVar6;
  if ((len & 0x3f) != 0) {
    uVar2 = 0;
    do {
      lVar4 = 0;
      do {
        flag_counts[lVar4] =
             flag_counts[lVar4] +
             (uint)(((byte)(*(undefined1 (*) [16])data)[uVar2] >> ((uint)lVar4 & 0x1f) & 1) != 0);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      uVar2 = uVar2 + 1;
    } while (uVar2 != (len & 0x3f));
  }
  return;
}

Assistant:

void pospopcnt_u8_sse_popcnt4bit(const uint8_t* data, size_t len, uint32_t* flag_counts) {
    const __m128i zero = _mm_setzero_si128();

    __m128i counter_a = zero;
    __m128i counter_b = zero;
    __m128i counter_c = zero;
    __m128i counter_d = zero;
    __m128i counter_e = zero;
    __m128i counter_f = zero;
    __m128i counter_g = zero;
    __m128i counter_h = zero;

    const __m128i popcnt_4bit = _mm_setr_epi8(
        /* 0 */ 0, /* 1 */ 1, /* 2 */ 1, /* 3 */ 2,
        /* 4 */ 1, /* 5 */ 2, /* 6 */ 2, /* 7 */ 3,
        /* 8 */ 1, /* 9 */ 2, /* a */ 2, /* b */ 3,
        /* c */ 2, /* d */ 3, /* e */ 3, /* f */ 4
    );

    const __m128i lo_nibble = _mm_set1_epi8(0x0f);

    int local = 0;
    __m128i counter8bit_a = zero;
    __m128i counter8bit_b = zero;
    __m128i counter8bit_c = zero;
    __m128i counter8bit_d = zero;
    __m128i counter8bit_e = zero;
    __m128i counter8bit_f = zero;
    __m128i counter8bit_g = zero;
    __m128i counter8bit_h = zero;

    for (const uint8_t* end = &data[(len & ~63)]; data != end; data += 64) {
        // r0 = [a0|b0|c0|d0|e0|f0|g0|h0]
        // r1 = [a1|b1|c1|d1|e1|f1|g1|h1]
        // r2 = [a2|b2|c2|d2|e2|f2|g2|h2]
        // r3 = [a3|b3|c3|d3|e3|f3|g3|h3]
        const __m128i r0 = _mm_loadu_si128((__m128i*)&data[0*16]);
        const __m128i r1 = _mm_loadu_si128((__m128i*)&data[1*16]);
        const __m128i r2 = _mm_loadu_si128((__m128i*)&data[2*16]);
        const __m128i r3 = _mm_loadu_si128((__m128i*)&data[3*16]);

        // s0 = [a0|a1|c0|c1|e0|e1|g0|g1]
        // s1 = [b0|b1|d0|d1|f0|f1|h0|h1]
        // s2 = [a2|a3|c2|c3|e2|e3|g2|g3]
        // s3 = [b2|b3|d2|d3|f2|f3|h2|h3]
        const __m128i s0 = sse4_merge1_even(r0, r1);
        const __m128i s1 = sse4_merge1_odd (r0, r1);
        const __m128i s2 = sse4_merge1_even(r2, r3);
        const __m128i s3 = sse4_merge1_odd (r2, r3);

        // d0 = [a0|a1|a2|a3|e0|e1|e2|e3]
        // d1 = [b0|b1|b2|b3|f0|f1|f2|f3]
        // d2 = [c0|c1|c2|c3|g0|g1|g2|g3]
        // d3 = [d0|d1|d2|d3|h0|h1|h2|h3]
        const __m128i d0 = sse4_merge2_even(s0, s2);
        const __m128i d1 = sse4_merge2_even(s1, s3);
        const __m128i d2 = sse4_merge2_odd (s0, s2);
        const __m128i d3 = sse4_merge2_odd (s1, s3);

        // popcnt for 4-bit subwords in each registers
        const __m128i popcnt_a = _mm_shuffle_epi8(popcnt_4bit, d0 & lo_nibble);
        const __m128i popcnt_e = _mm_shuffle_epi8(popcnt_4bit, _mm_srli_epi32(d0, 4) & lo_nibble);
        const __m128i popcnt_b = _mm_shuffle_epi8(popcnt_4bit, d1 & lo_nibble);
        const __m128i popcnt_f = _mm_shuffle_epi8(popcnt_4bit, _mm_srli_epi32(d1, 4) & lo_nibble);
        const __m128i popcnt_c = _mm_shuffle_epi8(popcnt_4bit, d2 & lo_nibble);
        const __m128i popcnt_g = _mm_shuffle_epi8(popcnt_4bit, _mm_srli_epi32(d2, 4) & lo_nibble);
        const __m128i popcnt_d = _mm_shuffle_epi8(popcnt_4bit, d3 & lo_nibble);
        const __m128i popcnt_h = _mm_shuffle_epi8(popcnt_4bit, _mm_srli_epi32(d3, 4) & lo_nibble);

        counter8bit_a = _mm_add_epi8(counter8bit_a, popcnt_a);
        counter8bit_b = _mm_add_epi8(counter8bit_b, popcnt_b);
        counter8bit_c = _mm_add_epi8(counter8bit_c, popcnt_c);
        counter8bit_d = _mm_add_epi8(counter8bit_d, popcnt_d);
        counter8bit_e = _mm_add_epi8(counter8bit_e, popcnt_e);
        counter8bit_f = _mm_add_epi8(counter8bit_f, popcnt_f);
        counter8bit_g = _mm_add_epi8(counter8bit_g, popcnt_g);
        counter8bit_h = _mm_add_epi8(counter8bit_h, popcnt_h);

        local += 1;
        if (local == 63) {
            // avoid overflows in the 8-bit counters
#define U(n) \
            counter_##n = _mm_add_epi64(counter_##n, _mm_sad_epu8(counter8bit_##n, zero)); \
            counter8bit_##n = _mm_setzero_si128();

            U(a) U(b) U(c) U(d)
            U(e) U(f) U(g) U(h)
#undef U
            local = 0;
        }
    }

    if (local != 0) {
#define U(n) counter_##n = _mm_add_epi64(counter_##n, _mm_sad_epu8(counter8bit_##n, zero));
        U(a) U(b) U(c) U(d)
        U(e) U(f) U(g) U(h)
#undef U
    }

    flag_counts[0] += sse4_sum_epu64(counter_a);
    flag_counts[1] += sse4_sum_epu64(counter_b);
    flag_counts[2] += sse4_sum_epu64(counter_c);
    flag_counts[3] += sse4_sum_epu64(counter_d);
    flag_counts[4] += sse4_sum_epu64(counter_e);
    flag_counts[5] += sse4_sum_epu64(counter_f);
    flag_counts[6] += sse4_sum_epu64(counter_g);
    flag_counts[7] += sse4_sum_epu64(counter_h);

    // scalar tail loop
    pospopcnt_u8_scalar_naive(data, len % 64, flag_counts);
}